

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# derivatives.cpp
# Opt level: O2

void lts2::DivergenceWithBackwardScheme(Mat *X1,Mat *X2,Mat *divX)

{
  undefined8 local_250;
  Mat DX1;
  Mat DX2;
  Scalar_<double> local_188 [11];
  
  if ((*(long *)(X1 + 0x10) != 0) && (*(long *)(X2 + 0x10) != 0)) {
    local_250 = CONCAT44((int)**(undefined8 **)(X1 + 0x40),
                         (int)((ulong)**(undefined8 **)(X1 + 0x40) >> 0x20));
    cv::Mat::create(divX,&local_250,5);
    cv::Scalar_<double>::all(local_188,0.0);
    _DX1 = -0x3efdfffa;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)divX,(_InputArray *)&DX1);
    cv::Mat::Mat(&DX1);
    HorizontalGradientWithBackwardScheme(X1,&DX1);
    cv::Mat::Mat(&DX2);
    VerticalGradientWithBackwardScheme(X2,&DX2);
    cv::operator+((Mat *)local_188,&DX1);
    (**(code **)(*(long *)local_188[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] + 0x18))
              (local_188[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0],local_188,divX,
               0xffffffffffffffff);
    cv::MatExpr::~MatExpr((MatExpr *)local_188);
    cv::Mat::~Mat(&DX2);
    cv::Mat::~Mat(&DX1);
  }
  return;
}

Assistant:

void lts2::DivergenceWithBackwardScheme(const Mat& X1, const Mat& X2, Mat& divX)
{	
    if (!X1.data || !X2.data)
        return;
    
	divX.create(X1.size(), CV_32F);
	divX.setTo(cv::Scalar::all(0));
    
	cv::Mat DX1;
    lts2::HorizontalGradientWithBackwardScheme(X1, DX1);
	
	cv::Mat DX2;
    lts2::VerticalGradientWithBackwardScheme(X2, DX2);
	
	divX = DX1 + DX2;
}